

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::percolateUp(Heap<Gluco::Solver::VarOrderLt> *this,int i)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  
  piVar4 = (this->heap).data;
  iVar3 = piVar4[i];
  if (i == 0) {
    piVar7 = (this->indices).data;
    piVar6 = piVar4;
    i = 0;
  }
  else {
    piVar7 = (this->indices).data;
    pdVar5 = ((this->lt).activity)->data;
    dVar2 = pdVar5[iVar3];
    do {
      uVar9 = i - 1;
      iVar8 = (int)uVar9 >> 1;
      pdVar1 = pdVar5 + piVar4[iVar8];
      piVar6 = piVar4 + i;
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
      piVar4[i] = piVar4[iVar8];
      piVar7[piVar4[iVar8]] = i;
      piVar6 = piVar4;
      i = iVar8;
    } while (1 < uVar9);
  }
  *piVar6 = iVar3;
  piVar7[iVar3] = i;
  return;
}

Assistant:

void percolateUp(int i)
    {
        int x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }